

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O0

bool __thiscall Vector3::operator<(Vector3 *this,Vector3 *rhs)

{
  Vector3 *rhs_local;
  Vector3 *this_local;
  bool local_1;
  
  if (rhs->x <= this->x) {
    if (this->x <= rhs->x) {
      if (rhs->y <= this->y) {
        if (this->y <= rhs->y) {
          local_1 = this->z < rhs->z;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Vector3::operator<(const Vector3 &rhs) const {
    if (x < rhs.x)
        return true;
    if (rhs.x < x)
        return false;
    if (y < rhs.y)
        return true;
    if (rhs.y < y)
        return false;
    return z < rhs.z;
}